

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  ushort uVar1;
  uint uVar2;
  ushort *puVar3;
  char *pcVar4;
  ushort *puVar5;
  ushort *__src;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ushort *puVar12;
  long lVar13;
  ushort *puVar14;
  ushort *__dest;
  
  uVar11 = (ulong)pPg->hdrOffset;
  puVar3 = (ushort *)pPg->aData;
  uVar2 = pPg->pBt->usableSize;
  puVar12 = (ushort *)((long)(int)uVar2 + (long)puVar3);
  puVar14 = (ushort *)pPg->aCellIdx;
  uVar1 = *(ushort *)((long)puVar3 + uVar11 + 5);
  uVar6 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
  uVar7 = (ulong)uVar6;
  if (uVar2 < uVar6) {
    uVar7 = 0;
  }
  pcVar4 = pPg->pBt->pPager->pTmpSpace;
  memcpy(pcVar4 + uVar7,(void *)((long)puVar3 + uVar7),(ulong)(uVar2 - (int)uVar7));
  uVar7 = 0;
  do {
    uVar9 = uVar7;
    if (5 < uVar9) break;
    uVar7 = uVar9 + 1;
  } while (pCArray->ixNx[uVar9] <= iFirst);
  lVar10 = (long)iFirst;
  __dest = puVar12;
  do {
    puVar5 = (ushort *)pCArray->apEnd[uVar9];
    do {
      __src = (ushort *)pCArray->apCell[lVar10];
      uVar7 = (ulong)pCArray->szCell[lVar10];
      if ((__src < puVar3) || (puVar12 <= __src)) {
        if ((__src < puVar5) && (puVar5 < (ushort *)((long)__src + uVar7))) {
          uVar8 = 0x111d3;
          goto LAB_00166311;
        }
      }
      else {
        if (puVar12 < (ushort *)((long)__src + uVar7)) {
          uVar8 = 0x111ce;
          goto LAB_00166311;
        }
        __src = (ushort *)((long)__src + ((long)pcVar4 - (long)puVar3));
      }
      __dest = (ushort *)((long)__dest - uVar7);
      lVar13 = (long)__dest - (long)puVar3;
      *puVar14 = (ushort)lVar13 << 8 | (ushort)lVar13 >> 8;
      puVar14 = puVar14 + 1;
      if (__dest < puVar14) {
        uVar8 = 0x111d9;
LAB_00166311:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
                    "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
        return 0xb;
      }
      memcpy(__dest,__src,uVar7);
      lVar10 = lVar10 + 1;
      if (iFirst + nCell <= lVar10) {
        pPg->nCell = (u16)nCell;
        pPg->nOverflow = '\0';
        *(undefined2 *)((long)puVar3 + uVar11 + 1) = 0;
        *(undefined1 *)((long)puVar3 + uVar11 + 3) = *(undefined1 *)((long)&pPg->nCell + 1);
        *(char *)((long)puVar3 + uVar11 + 4) = (char)pPg->nCell;
        *(char *)((long)puVar3 + uVar11 + 5) = (char)((ulong)lVar13 >> 8);
        *(char *)((long)puVar3 + uVar11 + 6) = (char)lVar13;
        *(undefined1 *)((long)puVar3 + uVar11 + 7) = 0;
        return 0;
      }
    } while (lVar10 < pCArray->ixNx[(int)uVar9]);
    uVar9 = (ulong)((int)uVar9 + 1);
  } while( true );
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( NEVER(j>(u32)usableSize) ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( sz!=pPg->xCellSize(pPg,pCell) );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}